

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertToLHProcess.cpp
# Opt level: O1

void __thiscall Assimp::FlipUVsProcess::ProcessMesh(FlipUVsProcess *this,aiMesh *pMesh)

{
  aiAnimMesh *paVar1;
  uint tcIdx;
  long lVar2;
  long lVar3;
  uint vIdx;
  ulong uVar4;
  ulong uVar5;
  
  if (pMesh != (aiMesh *)0x0) {
    lVar2 = 0;
    do {
      if ((pMesh->mTextureCoords[lVar2] == (aiVector3D *)0x0) || (pMesh->mNumVertices == 0)) break;
      lVar3 = 4;
      uVar4 = 0;
      do {
        *(float *)((long)&pMesh->mTextureCoords[lVar2]->x + lVar3) =
             1.0 - *(float *)((long)&pMesh->mTextureCoords[lVar2]->x + lVar3);
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0xc;
      } while (uVar4 < pMesh->mNumVertices);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
  }
  if (pMesh->mNumAnimMeshes != 0) {
    uVar4 = 0;
    do {
      paVar1 = pMesh->mAnimMeshes[uVar4];
      if (paVar1 != (aiAnimMesh *)0x0) {
        lVar2 = 0;
        do {
          if (paVar1->mTextureCoords[lVar2] == (aiVector3D *)0x0) break;
          if (paVar1->mNumVertices != 0) {
            lVar3 = 4;
            uVar5 = 0;
            do {
              *(float *)((long)&paVar1->mTextureCoords[lVar2]->x + lVar3) =
                   1.0 - *(float *)((long)&paVar1->mTextureCoords[lVar2]->x + lVar3);
              uVar5 = uVar5 + 1;
              lVar3 = lVar3 + 0xc;
            } while (uVar5 < paVar1->mNumVertices);
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 != 8);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < pMesh->mNumAnimMeshes);
  }
  return;
}

Assistant:

void flipUVs(aiMeshType* pMesh) {
    if (pMesh == nullptr) { return; }
    // mirror texture y coordinate
    for (unsigned int tcIdx = 0; tcIdx < AI_MAX_NUMBER_OF_TEXTURECOORDS; tcIdx++) {
        if (!pMesh->HasTextureCoords(tcIdx)) {
            break;
        }

        for (unsigned int vIdx = 0; vIdx < pMesh->mNumVertices; vIdx++) {
            pMesh->mTextureCoords[tcIdx][vIdx].y = 1.0f - pMesh->mTextureCoords[tcIdx][vIdx].y;
        }
    }
}